

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib507.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  char *pcVar8;
  undefined8 uVar9;
  timeval tVar10;
  undefined8 uStack_1d0;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar9 = _stderr;
  if (iVar1 != 0) {
    uVar3 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar9,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                  ,0x29,iVar1,uVar3);
    goto LAB_00102464;
  }
  lVar4 = curl_multi_init();
  if (lVar4 == 0) {
    lVar5 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                  ,0x2b);
    iVar2 = 0x7b;
LAB_0010238f:
    iVar1 = -1;
  }
  else {
    lVar5 = curl_easy_init();
    if (lVar5 == 0) {
      lVar5 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                    ,0x2d);
      iVar2 = 0x7c;
      goto LAB_0010238f;
    }
    iVar2 = curl_easy_setopt(lVar5,0x2712,URL);
    uVar9 = _stderr;
    if (iVar2 == 0) {
      iVar2 = curl_easy_setopt(lVar5,0x2a,1);
      uVar9 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_easy_strerror(iVar2);
        pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_1d0 = 0x30;
        goto LAB_00102434;
      }
      iVar2 = curl_multi_add_handle(lVar4,lVar5);
      uVar9 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_multi_strerror(iVar2);
        pcVar8 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
        uStack_1d0 = 0x32;
        goto LAB_00102434;
      }
      iVar2 = curl_multi_perform(lVar4,&still_running);
      uVar9 = _stderr;
      if (iVar2 != 0) {
        uVar3 = curl_multi_strerror(iVar2);
        pcVar8 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
        uStack_1d0 = 0x34;
        goto LAB_00102434;
      }
      if (still_running < 0) {
        curl_mfprintf(_stderr,
                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                      ,0x34);
        iVar2 = 0x7a;
        goto LAB_0010238f;
      }
      tVar10 = tutil_tvnow();
      lVar6 = tutil_tvdiff(tVar10,tv_test_start);
      if (60000 < lVar6) {
        curl_mfprintf(_stderr,
                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                      ,0x36);
        iVar2 = 0x7d;
        goto LAB_0010238f;
      }
      do {
        if (still_running == 0) {
          lVar6 = curl_multi_info_read(lVar4,&still_running);
          iVar2 = 0;
          if (lVar6 == 0) goto LAB_00102445;
          iVar1 = *(int *)(lVar6 + 0x10);
          goto LAB_00102449;
        }
        maxfd = -99;
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
          fdread.__fds_bits[lVar6] = 0;
        }
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
          fdwrite.__fds_bits[lVar6] = 0;
        }
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
          fdexcep.__fds_bits[lVar6] = 0;
        }
        timeout.tv_sec = 1;
        timeout.tv_usec = 0;
        iVar2 = curl_multi_fdset(lVar4,&fdread,&fdwrite,&fdexcep,&maxfd);
        uVar9 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_multi_strerror(iVar2);
          pcVar8 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
          uStack_1d0 = 0x45;
          goto LAB_00102434;
        }
        if (maxfd < -1) {
          pcVar8 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
          uStack_1d0 = 0x45;
LAB_00102762:
          curl_mfprintf(_stderr,pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                        ,uStack_1d0);
          iVar2 = 0x7a;
          goto LAB_00102445;
        }
        iVar1 = select_wrapper(maxfd + 1,&fdread,&fdwrite,&fdexcep,&timeout);
        if (iVar1 == -1) {
          piVar7 = __errno_location();
          uVar9 = _stderr;
          iVar1 = *piVar7;
          pcVar8 = strerror(iVar1);
          curl_mfprintf(uVar9,"%s:%d select() failed, with errno %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                        ,0x49,iVar1,pcVar8);
          iVar2 = 0x79;
          goto LAB_00102445;
        }
        tVar10 = tutil_tvnow();
        lVar6 = tutil_tvdiff(tVar10,tv_test_start);
        if (60000 < lVar6) {
          uStack_1d0 = 0x4b;
          goto LAB_00102714;
        }
        iVar2 = curl_multi_perform(lVar4,&still_running);
        uVar9 = _stderr;
        if (iVar2 != 0) {
          uVar3 = curl_multi_strerror(iVar2);
          pcVar8 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
          uStack_1d0 = 0x4d;
          goto LAB_00102434;
        }
        if (still_running < 0) {
          pcVar8 = 
          "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
          uStack_1d0 = 0x4d;
          goto LAB_00102762;
        }
        tVar10 = tutil_tvnow();
        lVar6 = tutil_tvdiff(tVar10,tv_test_start);
      } while (lVar6 < 0xea61);
      uStack_1d0 = 0x4f;
LAB_00102714:
      curl_mfprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                    ,uStack_1d0);
      iVar2 = 0x7d;
    }
    else {
      uVar3 = curl_easy_strerror(iVar2);
      pcVar8 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
      uStack_1d0 = 0x2f;
LAB_00102434:
      curl_mfprintf(uVar9,pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib507.c"
                    ,uStack_1d0,iVar2,uVar3);
    }
LAB_00102445:
    iVar1 = -1;
  }
LAB_00102449:
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar5);
  curl_global_cleanup();
  if (iVar2 != 0) {
    iVar1 = iVar2;
  }
LAB_00102464:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  CURLM *multi = NULL;
  int still_running;
  int i = -1;
  int res = 0;
  CURLMsg *msg;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &still_running);
  if(msg)
    /* this should now contain a result code from the easy handle,
       get it */
    i = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}